

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O3

void OpalOperator_SetKeyOn(OpalOperator *self,opal_bool on)

{
  bool bVar1;
  
  if (self->KeyOn != on) {
    self->KeyOn = on;
    if (on != 0) {
      bVar1 = self->AttackRate == 0xf;
      if (bVar1) {
        self->EnvelopeLevel = 0;
      }
      self->EnvelopeStage = (uint)bVar1;
      self->Phase = 0;
      return;
    }
    if ((self->EnvelopeStage != -1) && (self->EnvelopeStage != 3)) {
      self->EnvelopeStage = 3;
      return;
    }
  }
  return;
}

Assistant:

void OpalOperator_SetKeyOn(OpalOperator* self, opal_bool on)
{
    /* Already on/off? */
    if(self->KeyOn == on)
        return;

    self->KeyOn = on;

    if(on)
    {
        /* The highest attack rate is instant; it bypasses the attack phase */
        if(self->AttackRate == 15)
        {
            self->EnvelopeStage = OpalEnvDec;
            self->EnvelopeLevel = 0;
        }
        else
            self->EnvelopeStage = OpalEnvAtt;

        self->Phase = 0;

    }
    else
    {
        /* Stopping current sound? */
        if(self->EnvelopeStage != OpalEnvOff && self->EnvelopeStage != OpalEnvRel)
            self->EnvelopeStage = OpalEnvRel;
    }
}